

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int test_char_bit_count(void)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte local_42;
  uint8_t count_3;
  uint8_t i_3;
  int iStack_3c;
  uint8_t count_2;
  int length_2;
  int i_2;
  int iStack_30;
  uint8_t count_1;
  int length_1;
  int i_1;
  int iStack_24;
  uint8_t count;
  int length;
  int i;
  uint8_t dataset3 [4];
  uint8_t dataset2 [8];
  uint8_t dataset1 [8];
  int res;
  
  dataset1[0] = '\0';
  dataset1[1] = '\0';
  dataset1[2] = '\0';
  dataset1[3] = '\0';
  dataset2[0] = '\x01';
  dataset2[1] = '\x02';
  dataset2[2] = '\x04';
  dataset2[3] = '\b';
  dataset2[4] = '\x10';
  dataset2[5] = ' ';
  dataset2[6] = '@';
  dataset2[7] = 0x80;
  _i = 0x12110c0a09060503;
  length = 0x55aaf00f;
  for (iStack_24 = 0; iStack_24 < 8; iStack_24 = iStack_24 + 1) {
    cVar1 = char_bit_count(dataset2[iStack_24],8);
    if (cVar1 != '\x01') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x40,"count == 1");
      dataset1._0_4_ = dataset1._0_4_ + 1;
    }
  }
  for (iStack_30 = 0; iStack_30 < 8; iStack_30 = iStack_30 + 1) {
    cVar1 = char_bit_count(dataset3[(long)iStack_30 + -4],8);
    if (cVar1 != '\x02') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x46,"count == 2");
      dataset1._0_4_ = dataset1._0_4_ + 1;
    }
  }
  for (iStack_3c = 0; iStack_3c < 4; iStack_3c = iStack_3c + 1) {
    cVar1 = char_bit_count(*(undefined1 *)((long)&length + (long)iStack_3c),8);
    if (cVar1 != '\x04') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x4c,"count == 4");
      dataset1._0_4_ = dataset1._0_4_ + 1;
    }
  }
  for (local_42 = 0; local_42 < 9; local_42 = local_42 + 1) {
    bVar2 = char_bit_count(0xaa,local_42);
    if ((uint)bVar2 != local_42 / 2) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x52,"count == i / 2");
      dataset1._0_4_ = dataset1._0_4_ + 1;
    }
  }
  cVar1 = char_bit_count(4,2);
  if (cVar1 != '\0') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x56,"char_bit_count(0b100, 2) == 0");
    dataset1._0_4_ = dataset1._0_4_ + 1;
  }
  iVar3._0_1_ = dataset1[0];
  iVar3._1_1_ = dataset1[1];
  iVar3._2_1_ = dataset1[2];
  iVar3._3_1_ = dataset1[3];
  return iVar3;
}

Assistant:

static int test_char_bit_count() {
    int res = 0;
    //one bit dataset
    uint8_t dataset1[] = {
            1,
            1 << 1,
            1 << 2,
            1 << 3,
            1 << 4,
            1 << 5,
            1 << 6,
            1 << 7
    };
    //2 bit dataset
    uint8_t dataset2[] = {
            3, //11
            5, //101
            6, //011
            9, //1001
            10,// 0101
            12, //0011
            17, //10001
            18, //01001
    };

    //4 bit dataset
    uint8_t dataset3[] = {
            0xf,            //0b1111
            0xf ^ 0xff,     //0b11110000
            0xaa,           //0b10101010
            0xaa ^ 0xff,    //0b01010101
    };

    //check dataset1 1 bit

    for (int i = 0, length = sizeof(dataset1); i < length; ++i) {
        uint8_t count = char_bit_count(dataset1[i], 8);
        U_ASSERT(res, count == 1);
    }

    //check dataset2 2 bit
    for (int i = 0, length = sizeof(dataset2); i < length; ++i) {
        uint8_t count = char_bit_count(dataset2[i], 8);
        U_ASSERT(res, count == 2);
    }

    //check dataset3 4 bit
    for (int i = 0, length = sizeof(dataset3); i < length; ++i) {
        uint8_t count = char_bit_count(dataset3[i], 8);
        U_ASSERT(res, count == 4);
    }

    //check 0b10101010
    for (uint8_t i = 0; i <= 8; ++i) {
        uint8_t count = char_bit_count(0b10101010, i);
        U_ASSERT(res, count == i / 2);
    }

    //check 0b100
    U_ASSERT(res, char_bit_count(0b100, 2) == 0);

    return res;
}